

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FalseTests.cpp
# Opt level: O1

void __thiscall IsFalseTests::Run(IsFalseTests *this)

{
  undefined8 local_218;
  undefined8 uStack_210;
  code *local_208;
  code *local_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  code *local_1e8;
  code *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  code *local_1c8;
  code *local_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  code *local_1a8;
  code *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  code *local_188;
  code *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  code *local_168;
  code *local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  code *local_148;
  code *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  code *local_128;
  code *local_120;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Is::False(false) is true","");
  local_138 = 0;
  uStack_130 = 0;
  local_120 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:11:36)>
              ::_M_invoke;
  local_128 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:11:36)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_38);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,3);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Is::False(true) is not true","");
  local_158 = 0;
  uStack_150 = 0;
  local_140 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:15:39)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:15:39)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_58);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,3);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"Is::False has an error message","");
  local_178 = 0;
  uStack_170 = 0;
  local_160 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:19:42)>
              ::_M_invoke;
  local_168 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:19:42)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_78);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,3);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"Is::Not::False(true) is true","");
  local_198 = 0;
  uStack_190 = 0;
  local_180 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:23:40)>
              ::_M_invoke;
  local_188 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:23:40)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_98);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,3);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"Is::Not::False(false) is not true","");
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:27:45)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:27:45)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_b8);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,3);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0]);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"Is::False returns an Operand","");
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:31:40)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:31:40)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_d8);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,3);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"Is::Not::False returns an Operand","");
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:35:45)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:35:45)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_f8);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,3);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0]);
  }
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,"Is::Not::False has an error message","");
  local_218 = 0;
  uStack_210 = 0;
  local_200 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:39:47)>
              ::_M_invoke;
  local_208 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/FalseTests.cpp:39:47)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,(string *)local_118);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,3);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0]);
  }
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::False(false) is true", []() {
			AssertThat(ut11::Is::False(false), ut11::Is::True);
		});

		Then("Is::False(true) is not true", []() {
			AssertThat(ut11::Is::False(true), ut11::Is::Not::True);
		});

		Then("Is::False has an error message", []() {
			AssertThat(ut11::Is::False.GetErrorMessage(true), ut11::Is::Not::EqualTo(""));
		});

		Then("Is::Not::False(true) is true", []() {
			AssertThat(ut11::Is::Not::False(true), ut11::Is::True);
		});

		Then("Is::Not::False(false) is not true", []() {
			AssertThat(ut11::Is::Not::False(false), ut11::Is::Not::True);
		});

		Then("Is::False returns an Operand", []() {
			AssertThat( ut11::detail::IsOperand<decltype(ut11::Is::False)>::value, ut11::Is::True );
		});

		Then("Is::Not::False returns an Operand", []() {
			AssertThat( ut11::detail::IsOperand<decltype(ut11::Is::Not::False)>::value, ut11::Is::True );
		});

		Then("Is::Not::False has an error message", []() {
			AssertThat(ut11::Is::Not::False.GetErrorMessage(false), ut11::Is::Not::EqualTo(""));
		});
	}